

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogl_bitmap.c
# Opt level: O1

GLuint al_get_opengl_texture(ALLEGRO_BITMAP *bitmap)

{
  uint uVar1;
  GLuint GVar2;
  ALLEGRO_BITMAP *bitmap_00;
  
  bitmap_00 = bitmap->parent;
  if (bitmap->parent == (ALLEGRO_BITMAP *)0x0) {
    bitmap_00 = bitmap;
  }
  uVar1 = al_get_bitmap_flags(bitmap_00);
  GVar2 = 0;
  if ((uVar1 & 0x20) != 0) {
    GVar2 = *(GLuint *)((long)bitmap_00->extra + 8);
  }
  return GVar2;
}

Assistant:

GLuint al_get_opengl_texture(ALLEGRO_BITMAP *bitmap)
{
   ALLEGRO_BITMAP_EXTRA_OPENGL *extra;
   if (bitmap->parent)
      bitmap = bitmap->parent;
   if (!(al_get_bitmap_flags(bitmap) & _ALLEGRO_INTERNAL_OPENGL))
      return 0;
   extra = bitmap->extra;
   return extra->texture;
}